

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::setLoggingCallback
          (CoreBroker *this,
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *logFunction)

{
  bool bVar1;
  GlobalBrokerId id;
  long in_RDI;
  uint16_t index;
  ActionMessage loggerUpdate;
  size_type in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  uint16_t in_stack_ffffffffffffff06;
  undefined4 in_stack_ffffffffffffff18;
  action_t in_stack_ffffffffffffff1c;
  ActionMessage *in_stack_ffffffffffffff20;
  GlobalFederateId local_cc;
  action_t in_stack_ffffffffffffff38;
  int32_t iVar2;
  InterfaceHandle in_stack_ffffffffffffff44;
  CoreBroker *in_stack_ffffffffffffff78;
  
  ActionMessage::ActionMessage(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  iVar2 = 0x250;
  id = CLI::std::atomic<helics::GlobalBrokerId>::load
                 ((atomic<helics::GlobalBrokerId> *)(in_RDI + 0x10),seq_cst);
  GlobalFederateId::GlobalFederateId(&local_cc,id);
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)0x53416b);
  if (bVar1) {
    in_stack_ffffffffffffff06 = getNextAirlockIndex(in_stack_ffffffffffffff78);
    CLI::std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_3UL>::
    operator[]((array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_3UL>
                *)CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
    load<std::function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>>
              ((AirLock<std::any,_std::mutex,_std::condition_variable> *)in_stack_ffffffffffffff20,
               (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  else {
    setActionFlag<helics::ActionMessage,helics::MessageFlags>
              ((ActionMessage *)&stack0xffffffffffffff38,empty_flag);
  }
  gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>
  ::push<helics::ActionMessage&>
            ((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
             CONCAT44(in_stack_ffffffffffffff44.hid,local_cc.gid),
             (ActionMessage *)CONCAT44(iVar2,in_stack_ffffffffffffff38));
  ActionMessage::~ActionMessage
            ((ActionMessage *)CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00));
  return;
}

Assistant:

void CoreBroker::setLoggingCallback(
    std::function<void(int, std::string_view, std::string_view)> logFunction)
{
    ActionMessage loggerUpdate(CMD_BROKER_CONFIGURE);
    loggerUpdate.messageID = UPDATE_LOGGING_CALLBACK;
    loggerUpdate.source_id = global_id.load();
    if (logFunction) {
        auto index = getNextAirlockIndex();
        dataAirlocks[index].load(std::move(logFunction));
        loggerUpdate.counter = index;
    } else {
        setActionFlag(loggerUpdate, empty_flag);
    }

    actionQueue.push(loggerUpdate);
}